

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaValDecimalCompare(xmlSchemaValDecimal *lhs,xmlSchemaValDecimal *rhs)

{
  byte *__s1;
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  
  pbVar2 = lhs->str;
  __s1 = pbVar2 + 1;
  iVar4 = strcmp((char *)__s1,"0.0");
  pbVar3 = rhs->str;
  if ((iVar4 == 0) && (iVar4 = strcmp((char *)(pbVar3 + 1),"0.0"), iVar4 == 0)) {
    return 0;
  }
  bVar1 = *pbVar2;
  if (bVar1 == *pbVar3) {
    iVar4 = lhs->integralPlaces - rhs->integralPlaces;
    if (iVar4 == 0) {
      iVar4 = strcmp((char *)__s1,(char *)(pbVar3 + 1));
    }
    iVar4 = iVar4 * ((uint)(bVar1 != 0x2d) * 2 + -1);
  }
  else {
    iVar4 = (uint)*pbVar3 - (uint)bVar1;
  }
  return iVar4;
}

Assistant:

static int xmlSchemaValDecimalCompare(const xmlSchemaValDecimal *lhs, const xmlSchemaValDecimal *rhs)
{
    int sign = 1;
    /* may be +0 and -0 for some reason, handle */
    if(strcmp((const char*)lhs->str+1, "0.0") == 0 &&
        strcmp((const char*)rhs->str+1, "0.0") == 0)
    {
        return 0;
    }
    /* first take care of sign */
    if(lhs->str[0] != rhs->str[0])
    {
        /* ASCII- > ASCII+ */
        return rhs->str[0]-lhs->str[0];
    }
    /* signs are equal, but if negative the comparison must be reversed */
    if(lhs->str[0] == '-')
    {
        sign = -1;
    }
    /* internal representation never contains leading zeroes, longer decimal representation = larger number */
    if(lhs->integralPlaces != rhs->integralPlaces)
    {
        return ((int)lhs->integralPlaces-(int)rhs->integralPlaces)*sign;
    }
    /* same length, only digits => lexicographical sorting == numerical sorting.
       If integral parts are equal it will compare compare fractional parts. Again, lexicographical is good enough,
       length doesn't matter. We'll be starting from 0.1, always comparing like to like, and NULL < '0'
       If one is shorter and is equal until end, it must be smaller, since there are no trailing zeroes
       and the longer number must therefore have at least one non-zero digit after the other has ended.
       +1 to skip the sign
    */
    return strcmp((const char*)lhs->str+1, (const char*)rhs->str+1)*sign;
}